

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall cmdline::parser::check(parser *this,int argc,bool ok)

{
  bool bVar1;
  ostream *poVar2;
  string sStack_58;
  string local_38;
  
  if (argc != 1 || ok) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_58,"help",(allocator<char> *)&local_38);
    bVar1 = exist(this,&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    if (!bVar1) {
      if (ok) {
        return;
      }
      error_abi_cxx11_(&sStack_58,this);
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&sStack_58);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      usage_abi_cxx11_(&local_38,this);
      std::operator<<(poVar2,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&sStack_58);
      exit(1);
    }
  }
  usage_abi_cxx11_(&sStack_58,this);
  std::operator<<((ostream *)&std::cerr,(string *)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  exit(0);
}

Assistant:

void check(int argc, bool ok) {
        if ((argc == 1 && !ok) || exist("help")) {
            std::cerr << usage();
            exit(0);
        }

        if (!ok) {
            std::cerr << error() << std::endl << usage();
            exit(1);
        }
    }